

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mFILE.c
# Opt level: O0

mFILE * mfcreate(char *data,int size)

{
  mFILE *mf;
  int size_local;
  char *data_local;
  
  data_local = (char *)malloc(0x38);
  if (data_local == (char *)0x0) {
    data_local = (char *)0x0;
  }
  else {
    data_local[0] = '\0';
    data_local[1] = '\0';
    data_local[2] = '\0';
    data_local[3] = '\0';
    data_local[4] = '\0';
    data_local[5] = '\0';
    data_local[6] = '\0';
    data_local[7] = '\0';
    *(char **)(data_local + 8) = data;
    *(long *)(data_local + 0x10) = (long)size;
    *(long *)(data_local + 0x20) = (long)size;
    data_local[0x18] = '\0';
    data_local[0x19] = '\0';
    data_local[0x1a] = '\0';
    data_local[0x1b] = '\0';
    data_local[0x28] = '\0';
    data_local[0x29] = '\0';
    data_local[0x2a] = '\0';
    data_local[0x2b] = '\0';
    data_local[0x2c] = '\0';
    data_local[0x2d] = '\0';
    data_local[0x2e] = '\0';
    data_local[0x2f] = '\0';
    data_local[0x30] = '\0';
    data_local[0x31] = '\0';
    data_local[0x32] = '\0';
    data_local[0x33] = '\0';
    data_local[0x34] = '\0';
    data_local[0x35] = '\0';
    data_local[0x36] = '\0';
    data_local[0x37] = '\0';
    data_local[0x1c] = '\x03';
    data_local[0x1d] = '\0';
    data_local[0x1e] = '\0';
    data_local[0x1f] = '\0';
  }
  return (mFILE *)data_local;
}

Assistant:

mFILE *mfcreate(char *data, int size) {
    mFILE *mf = (mFILE *)malloc(sizeof(*mf));
    if (NULL == mf) return NULL;
    mf->fp = NULL;
    mf->data = data;
    mf->alloced = size;
    mf->size = size;
    mf->eof = 0;
    mf->offset = 0;
    mf->flush_pos = 0;
    mf->mode = MF_READ | MF_WRITE;
    return mf;
}